

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_send(uv_udp_send_t *req,uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr,
                uint addrlen,uv_udp_send_cb send_cb)

{
  anon_union_8_2_bf76bca6_for_active_reqs *paVar1;
  uint *puVar2;
  size_t sVar3;
  long *plVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uv_buf_t *__dest;
  size_t sVar9;
  
  if (nbufs == 0) {
    __assert_fail("nbufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0x2e6,
                  "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                 );
  }
  if ((addr == (sockaddr *)0x0) ||
     (iVar6 = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family,0), iVar6 == 0)) {
    sVar3 = handle->send_queue_count;
    req->type = UV_UDP_SEND;
    paVar1 = &handle->loop->active_reqs;
    paVar1->count = paVar1->count + 1;
    if (0x80 < addrlen) {
      __assert_fail("addrlen <= sizeof(req->addr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                    ,0x2f5,
                    "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                   );
    }
    if (addr == (sockaddr *)0x0) {
      (req->addr).ss_family = 0;
    }
    else {
      memcpy(&req->addr,addr,(ulong)addrlen);
    }
    req->send_cb = send_cb;
    req->handle = handle;
    req->nbufs = nbufs;
    __dest = req->bufsml;
    req->bufs = __dest;
    if (4 < nbufs) {
      __dest = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
      req->bufs = __dest;
      if (__dest == (uv_buf_t *)0x0) {
        uVar8 = (handle->loop->active_reqs).count;
        if (uVar8 != 0) {
          (handle->loop->active_reqs).count = uVar8 - 1;
          return -0xc;
        }
        __assert_fail("uv__has_active_reqs(handle->loop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0x303,
                      "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                     );
      }
    }
    memcpy(__dest,bufs,(ulong)nbufs << 4);
    sVar9 = uv__count_bufs(req->bufs,req->nbufs);
    handle->send_queue_size = sVar9 + handle->send_queue_size;
    handle->send_queue_count = handle->send_queue_count + 1;
    req->queue[0] = handle->write_queue;
    plVar4 = (long *)handle->write_queue[1];
    req->queue[1] = plVar4;
    *plVar4 = (long)req->queue;
    handle->write_queue[1] = req->queue;
    uVar8 = handle->flags;
    if ((uVar8 & 4) == 0) {
      uVar7 = uVar8 | 4;
      handle->flags = uVar7;
      uVar5 = uVar8 & 8;
      uVar8 = uVar7;
      if (uVar5 != 0) {
        puVar2 = &handle->loop->active_handles;
        *puVar2 = *puVar2 + 1;
      }
    }
    if ((sVar3 == 0) && ((uVar8 & 0x1000000) == 0)) {
      uv__udp_sendmsg(handle);
      iVar6 = 0;
      if (handle->write_queue != (void **)handle->write_queue[0]) {
        uv__io_start(handle->loop,&handle->io_watcher,4);
      }
    }
    else {
      uv__io_start(handle->loop,&handle->io_watcher,4);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int uv__udp_send(uv_udp_send_t* req,
                 uv_udp_t* handle,
                 const uv_buf_t bufs[],
                 unsigned int nbufs,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 uv_udp_send_cb send_cb) {
  int err;
  int empty_queue;

  assert(nbufs > 0);

  if (addr) {
    err = uv__udp_maybe_deferred_bind(handle, addr->sa_family, 0);
    if (err)
      return err;
  }

  /* It's legal for send_queue_count > 0 even when the write_queue is empty;
   * it means there are error-state requests in the write_completed_queue that
   * will touch up send_queue_size/count later.
   */
  empty_queue = (handle->send_queue_count == 0);

  uv__req_init(handle->loop, req, UV_UDP_SEND);
  assert(addrlen <= sizeof(req->addr));
  if (addr == NULL)
    req->addr.ss_family = AF_UNSPEC;
  else
    memcpy(&req->addr, addr, addrlen);
  req->send_cb = send_cb;
  req->handle = handle;
  req->nbufs = nbufs;

  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(bufs[0]));

  if (req->bufs == NULL) {
    uv__req_unregister(handle->loop, req);
    return UV_ENOMEM;
  }

  memcpy(req->bufs, bufs, nbufs * sizeof(bufs[0]));
  handle->send_queue_size += uv__count_bufs(req->bufs, req->nbufs);
  handle->send_queue_count++;
  QUEUE_INSERT_TAIL(&handle->write_queue, &req->queue);
  uv__handle_start(handle);

  if (empty_queue && !(handle->flags & UV_HANDLE_UDP_PROCESSING)) {
    uv__udp_sendmsg(handle);

    /* `uv__udp_sendmsg` may not be able to do non-blocking write straight
     * away. In such cases the `io_watcher` has to be queued for asynchronous
     * write.
     */
    if (!QUEUE_EMPTY(&handle->write_queue))
      uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);
  } else {
    uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);
  }

  return 0;
}